

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O1

int DSA_check_signature(int *out_valid,uint8_t *digest,size_t digest_len,uint8_t *sig,size_t sig_len
                       ,DSA *dsa)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  DSA_SIG *pDVar4;
  DSA_SIG *s;
  uint8_t *der;
  uint8_t *sigp;
  DSA_SIG *local_50;
  uchar *local_48;
  DSA *local_40;
  uint8_t *local_38;
  
  local_50 = (DSA_SIG *)0x0;
  local_48 = (uchar *)0x0;
  local_40 = dsa;
  local_50 = (DSA_SIG *)OPENSSL_zalloc(0x10);
  iVar3 = 0;
  if (local_50 != (DSA_SIG *)0x0) {
    local_38 = sig;
    pDVar4 = d2i_DSA_SIG(&local_50,&local_38,sig_len);
    iVar3 = 0;
    if ((pDVar4 != (DSA_SIG *)0x0) && (local_38 == sig + sig_len)) {
      uVar1 = i2d_DSA_SIG(local_50,&local_48);
      iVar3 = 0;
      if (uVar1 == sig_len && -1 < (int)uVar1) {
        if (sig_len != 0) {
          iVar2 = bcmp(sig,local_48,sig_len);
          if (iVar2 != 0) goto LAB_001d272a;
        }
        iVar3 = DSA_do_check_signature(out_valid,digest,digest_len,(DSA_SIG *)local_50,local_40);
      }
    }
  }
LAB_001d272a:
  OPENSSL_free(local_48);
  DSA_SIG_free(local_50);
  return iVar3;
}

Assistant:

int DSA_check_signature(int *out_valid, const uint8_t *digest,
                        size_t digest_len, const uint8_t *sig, size_t sig_len,
                        const DSA *dsa) {
  DSA_SIG *s = NULL;
  int ret = 0;
  uint8_t *der = NULL;

  s = DSA_SIG_new();
  {
    if (s == NULL) {
      goto err;
    }

    const uint8_t *sigp = sig;
    if (d2i_DSA_SIG(&s, &sigp, sig_len) == NULL || sigp != sig + sig_len) {
      goto err;
    }

    // Ensure that the signature uses DER and doesn't have trailing garbage.
    int der_len = i2d_DSA_SIG(s, &der);
    if (der_len < 0 || (size_t)der_len != sig_len ||
        OPENSSL_memcmp(sig, der, sig_len)) {
      goto err;
    }

    ret = DSA_do_check_signature(out_valid, digest, digest_len, s, dsa);
  }

err:
  OPENSSL_free(der);
  DSA_SIG_free(s);
  return ret;
}